

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O1

bool __thiscall cmQtAutoGenerator::InfoT::LogError(InfoT *this,GenT genType,string_view message)

{
  cmQtAutoGenerator *pcVar1;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view text;
  string_view message_00;
  string local_c8;
  string local_a8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_88;
  size_type local_70;
  pointer local_68;
  string *local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  size_t local_40;
  char *local_38;
  undefined8 local_30;
  
  text._M_str = message._M_str;
  pcVar1 = this->Gen_;
  text._M_len = (size_t)(pcVar1->InfoFile_)._M_dataplus._M_p;
  cmQtAutoGen::Quoted_abi_cxx11_(&local_a8,(cmQtAutoGen *)(pcVar1->InfoFile_)._M_string_length,text)
  ;
  local_88.first._M_len = 0x18;
  local_88.first._M_str = "Info error in info file\n";
  local_88.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_70 = local_a8._M_string_length;
  local_68 = local_a8._M_dataplus._M_p;
  local_58 = 2;
  local_50 = ":\n";
  local_48 = 0;
  local_30 = 0;
  views._M_len = 4;
  views._M_array = &local_88;
  local_60 = &local_a8;
  local_40 = message._M_len;
  local_38 = text._M_str;
  cmCatViews(&local_c8,views);
  message_00._M_str = local_c8._M_dataplus._M_p;
  message_00._M_len = local_c8._M_string_length;
  Logger::Error(&pcVar1->Logger_,genType,message_00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmQtAutoGenerator::InfoT::LogError(GenT genType,
                                        cm::string_view message) const
{
  this->Gen_.Log().Error(genType,
                         cmStrCat("Info error in info file\n",
                                  Quoted(this->Gen_.InfoFile()), ":\n",
                                  message));
  return false;
}